

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O3

int satoko_parse_dimacs(char *fname,satoko_t **solver)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  ushort **ppuVar9;
  char *pcVar10;
  uint *__ptr;
  ulong uVar11;
  char *token;
  char *local_50;
  satoko_t *local_48;
  char *local_40;
  satoko_t **local_38;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Couldn\'t open file: %s\n",fname);
LAB_0055a37c:
    iVar4 = -1;
  }
  else {
    __ptr = (uint *)0x0;
    local_38 = solver;
    fseek(__stream,0,2);
    lVar6 = ftell(__stream);
    rewind(__stream);
    pcVar7 = (char *)malloc((lVar6 << 0x20) + 0x300000000 >> 0x20);
    fread(pcVar7,(long)(int)lVar6,1,__stream);
    pcVar7[(int)lVar6] = '\n';
    pcVar7[(lVar6 << 0x20) + 0x100000000 >> 0x20] = '\0';
    local_48 = (satoko_t *)0x0;
    local_40 = pcVar7;
    do {
      while( true ) {
        while( true ) {
          local_50 = pcVar7;
          skip_spaces(&local_50);
          cVar1 = *local_50;
          if (cVar1 != 'c') break;
          while (((pcVar10 = local_50 + 1, pcVar7 = pcVar10, cVar1 != '\n' && (cVar1 != '\r')) &&
                 (pcVar7 = local_50, cVar1 != -1))) {
            local_50 = pcVar10;
            cVar1 = *pcVar10;
          }
        }
        if (cVar1 == '\0') {
          if (*(void **)(__ptr + 2) != (void *)0x0) {
            free(*(void **)(__ptr + 2));
          }
          free(__ptr);
          free(local_40);
          *local_38 = local_48;
          return 1;
        }
        if (cVar1 != 'p') break;
        local_50 = local_50 + 1;
        skip_spaces(&local_50);
        ppuVar9 = __ctype_b_loc();
        bVar2 = *(byte *)((long)*ppuVar9 + (long)*local_50 * 2 + 1);
        while ((bVar2 & 0x20) == 0) {
          local_50 = local_50 + 1;
          bVar2 = *(byte *)((long)*ppuVar9 + (long)*local_50 * 2 + 1);
        }
        uVar5 = read_int(&local_50);
        read_int(&local_50);
        pcVar7 = local_50;
        do {
          local_50 = pcVar7;
          pcVar10 = local_50 + 1;
          cVar1 = *local_50;
          if ((cVar1 == '\n') || (cVar1 == '\r')) break;
          pcVar7 = pcVar10;
          pcVar10 = local_50;
        } while (cVar1 != -1);
        local_50 = pcVar10;
        __ptr = (uint *)malloc(0x10);
        if (uVar5 - 1 < 0xf) {
          uVar5 = 0x10;
        }
        __ptr[1] = 0;
        *__ptr = uVar5;
        if (uVar5 == 0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = malloc((ulong)uVar5 << 2);
        }
        *(void **)(__ptr + 2) = pvVar8;
        local_48 = satoko_create();
        pcVar7 = local_50;
      }
      if (__ptr == (uint *)0x0) {
        puts("There is no parameter line.");
        free(local_40);
        goto LAB_0055a37c;
      }
      __ptr[1] = 0;
      while (iVar4 = read_int(&local_50), iVar4 != 0) {
        iVar3 = -iVar4;
        if (0 < iVar4) {
          iVar3 = iVar4;
        }
        uVar5 = __ptr[1];
        uVar11 = (ulong)uVar5;
        if (uVar5 == *__ptr) {
          if (uVar5 < 0x10) {
            pvVar8 = realloc(*(void **)(__ptr + 2),0x40);
            *(void **)(__ptr + 2) = pvVar8;
            if (pvVar8 == (void *)0x0) {
LAB_0055a411:
              __assert_fail("p->data != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                            ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
            }
            uVar5 = 0x10;
          }
          else {
            pvVar8 = *(void **)(__ptr + 2);
            if ((int)uVar5 < 1) goto LAB_0055a1ec;
            pvVar8 = realloc(pvVar8,uVar11 * 8);
            *(void **)(__ptr + 2) = pvVar8;
            if (pvVar8 == (void *)0x0) goto LAB_0055a411;
            uVar5 = uVar5 * 2;
          }
          *__ptr = uVar5;
          uVar11 = (ulong)__ptr[1];
        }
        else {
          pvVar8 = *(void **)(__ptr + 2);
        }
LAB_0055a1ec:
        *(uint *)((long)pvVar8 + uVar11 * 4) = ((iVar4 < 1) - 2) + iVar3 * 2;
        __ptr[1] = __ptr[1] + 1;
      }
      iVar4 = satoko_add_clause(local_48,*(int **)(__ptr + 2),__ptr[1]);
      pcVar7 = local_50;
    } while (iVar4 != 0);
    iVar4 = 0;
    printf("Unable to add clause: ");
    fprintf(_stdout,"Vector has %u(%u) entries: {",(ulong)__ptr[1],(ulong)*__ptr);
    if (__ptr[1] != 0) {
      uVar11 = 0;
      do {
        fprintf(_stdout," %u",(ulong)*(uint *)(*(long *)(__ptr + 2) + uVar11 * 4));
        uVar11 = uVar11 + 1;
      } while (uVar11 < __ptr[1]);
    }
    fwrite(" }\n",3,1,_stdout);
  }
  return iVar4;
}

Assistant:

int satoko_parse_dimacs(char *fname, satoko_t **solver)
{
    satoko_t *p = NULL;
    vec_uint_t *lits = NULL;
    int n_var;
    int n_clause;
    char *buffer = file_open(fname);
    char *token;

    if (buffer == NULL)
        return -1;

    token = buffer;
    while (1) {
        skip_spaces(&token);
        if (*token == 0)
            break;
        else if (*token == 'c')
            skip_line(&token);
        else if (*token == 'p') {
            token++;
            skip_spaces(&token);
            for(; !isspace(*token); token++); /* skip 'cnf' */

            n_var = read_int(&token);
            n_clause = read_int(&token);
            skip_line(&token);
            lits = vec_uint_alloc((unsigned) n_var);
            p = satoko_create();
        } else {
            if (lits == NULL) {
                printf("There is no parameter line.\n");
                satoko_free(buffer);
                return -1;
            }
            read_clause(&token, lits);
            if (!satoko_add_clause(p, (int*)vec_uint_data(lits), vec_uint_size(lits))) {
                printf("Unable to add clause: ");
                vec_uint_print(lits);
                return SATOKO_ERR;
            }
            }
    }
    vec_uint_free(lits);
    satoko_free(buffer);
    *solver = p;
    return SATOKO_OK;
}